

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::~MeshEdgebreakerTraversalValenceEncoder
          (MeshEdgebreakerTraversalValenceEncoder *this)

{
  MeshEdgebreakerTraversalEncoder *in_RDI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *unaff_retaddr;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(unaff_retaddr);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
  ~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                    *)0x1a6140);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
  ::~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                      *)0x1a6151);
  MeshEdgebreakerTraversalEncoder::~MeshEdgebreakerTraversalEncoder(in_RDI);
  return;
}

Assistant:

MeshEdgebreakerTraversalValenceEncoder()
      : corner_table_(nullptr),
        prev_symbol_(-1),
        last_corner_(kInvalidCornerIndex),
        num_symbols_(0),
        min_valence_(2),
        max_valence_(7) {}